

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O2

void __thiscall MeterPrivate::MeterPrivate(MeterPrivate *this,Meter *parent)

{
  this->drawValue = true;
  this->drawGridValues = true;
  this->valuePrecision = 0;
  this->scalePrecision = 0;
  this->currentThreshold = 0;
  this->radius = 100;
  this->startScaleAngle = 0x1e;
  this->stopScaleAngle = 0x14a;
  *(undefined4 *)&this->minValue = 0;
  *(undefined4 *)((long)&this->minValue + 4) = 0;
  *(undefined4 *)&this->maxValue = 0;
  *(undefined4 *)((long)&this->maxValue + 4) = 0x40590000;
  *(undefined4 *)&this->value = 0;
  *(undefined4 *)((long)&this->value + 4) = 0;
  *(undefined4 *)&this->scaleStep = 0;
  *(undefined4 *)((long)&this->scaleStep + 4) = 0x3ff00000;
  this->scaleGridStep = 10.0;
  QColor::QColor(&this->backgroundColor,black);
  QColor::QColor(&this->needleColor,blue);
  QColor::QColor(&this->textColor,white);
  QColor::QColor(&this->gridColor,white);
  (this->unitsLabel).d.ptr = (char16_t *)0x0;
  (this->unitsLabel).d.size = 0;
  (this->label).d.size = 0;
  (this->unitsLabel).d.d = (Data *)0x0;
  (this->label).d.d = (Data *)0x0;
  (this->label).d.ptr = (char16_t *)0x0;
  (this->ranges).d.d =
       (QMapData<std::multimap<int,_MeterPrivate::RangeData,_std::less<int>,_std::allocator<std::pair<const_int,_MeterPrivate::RangeData>_>_>_>
        *)0x0;
  this->q = parent;
  return;
}

Assistant:

explicit MeterPrivate( Meter * parent )
		:  drawValue( true )
		,  drawGridValues( true )
		,  valuePrecision( 0 )
		,  scalePrecision( 0 )
		,  currentThreshold( 0 )
		,  radius( 100 )
		,  startScaleAngle( 30 )
		,  stopScaleAngle( 330 )
		,  minValue( 0.0 )
		,  maxValue( 100.0 )
		,  value( 0.0 )
		,  scaleStep( 1.0 )
		,  scaleGridStep( 10.0 )
		,  backgroundColor( Qt::black )
		,  needleColor( Qt::blue )
		,  textColor( Qt::white )
		,  gridColor( Qt::white )
		,  q( parent )
	{
	}